

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NinjaBuildCommand.cpp
# Opt level: O0

FileInfo * __thiscall anon_unknown.dwarf_83ee8::BuildValue::getOutputInfo(BuildValue *this)

{
  bool bVar1;
  bool bVar2;
  BuildValue *this_local;
  
  bVar1 = isExistingInput(this);
  if (!bVar1) {
    bVar2 = isSuccessfulCommand(this);
    bVar1 = false;
    if (!bVar2) goto LAB_0014c43b;
  }
  bVar1 = true;
LAB_0014c43b:
  if (!bVar1) {
    __assert_fail("(isExistingInput() || isSuccessfulCommand()) && \"invalid call for value kind\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Commands/NinjaBuildCommand.cpp"
                  ,0x11a,"const FileInfo &(anonymous namespace)::BuildValue::getOutputInfo() const")
    ;
  }
  bVar1 = hasMultipleOutputs(this);
  if (!bVar1) {
    return (FileInfo *)&this->valueData;
  }
  __assert_fail("!hasMultipleOutputs() && \"invalid call on result with multiple outputs\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Commands/NinjaBuildCommand.cpp"
                ,0x11c,"const FileInfo &(anonymous namespace)::BuildValue::getOutputInfo() const");
}

Assistant:

const FileInfo& getOutputInfo() const {
    assert((isExistingInput() || isSuccessfulCommand()) &&
           "invalid call for value kind");
    assert(!hasMultipleOutputs() &&
           "invalid call on result with multiple outputs");
    return valueData.asOutputInfo;
  }